

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

Curl_multi * Curl_multi_handle(int hashsize,int chashsize,int dnssize)

{
  int iVar1;
  Curl_multi *multi;
  int dnssize_local;
  int chashsize_local;
  int hashsize_local;
  
  _chashsize_local = (Curl_multi *)(*Curl_ccalloc)(1,400);
  if (_chashsize_local == (Curl_multi *)0x0) {
    _chashsize_local = (Curl_multi *)0x0;
  }
  else {
    _chashsize_local->magic = 0xbab1e;
    Curl_init_dnscache(&_chashsize_local->hostcache,dnssize);
    sh_init(&_chashsize_local->sockhash,hashsize);
    iVar1 = Curl_conncache_init(&_chashsize_local->conn_cache,chashsize);
    if (iVar1 == 0) {
      Curl_llist_init(&_chashsize_local->msglist,(Curl_llist_dtor)0x0);
      Curl_llist_init(&_chashsize_local->pending,(Curl_llist_dtor)0x0);
      _chashsize_local->multiplexing = true;
      _chashsize_local->maxconnects = -1;
      _chashsize_local->max_concurrent_streams = 100;
      iVar1 = socketpair(1,1,0,_chashsize_local->wakeup_pair);
      if (iVar1 < 0) {
        _chashsize_local->wakeup_pair[0] = -1;
        _chashsize_local->wakeup_pair[1] = -1;
      }
      else {
        iVar1 = curlx_nonblock(_chashsize_local->wakeup_pair[0],1);
        if ((iVar1 < 0) || (iVar1 = curlx_nonblock(_chashsize_local->wakeup_pair[1],1), iVar1 < 0))
        {
          close(_chashsize_local->wakeup_pair[0]);
          close(_chashsize_local->wakeup_pair[1]);
          _chashsize_local->wakeup_pair[0] = -1;
          _chashsize_local->wakeup_pair[1] = -1;
        }
      }
    }
    else {
      sockhash_destroy(&_chashsize_local->sockhash);
      Curl_hash_destroy(&_chashsize_local->hostcache);
      Curl_conncache_destroy(&_chashsize_local->conn_cache);
      Curl_llist_destroy(&_chashsize_local->msglist,(void *)0x0);
      Curl_llist_destroy(&_chashsize_local->pending,(void *)0x0);
      (*Curl_cfree)(_chashsize_local);
      _chashsize_local = (Curl_multi *)0x0;
    }
  }
  return _chashsize_local;
}

Assistant:

struct Curl_multi *Curl_multi_handle(int hashsize, /* socket hash */
                                     int chashsize, /* connection hash */
                                     int dnssize) /* dns hash */
{
  struct Curl_multi *multi = calloc(1, sizeof(struct Curl_multi));

  if(!multi)
    return NULL;

  multi->magic = CURL_MULTI_HANDLE;

  Curl_init_dnscache(&multi->hostcache, dnssize);

  sh_init(&multi->sockhash, hashsize);

  if(Curl_conncache_init(&multi->conn_cache, chashsize))
    goto error;

  Curl_llist_init(&multi->msglist, NULL);
  Curl_llist_init(&multi->pending, NULL);

  multi->multiplexing = TRUE;

  /* -1 means it not set by user, use the default value */
  multi->maxconnects = -1;
  multi->max_concurrent_streams = 100;

#ifdef USE_WINSOCK
  multi->wsa_event = WSACreateEvent();
  if(multi->wsa_event == WSA_INVALID_EVENT)
    goto error;
#else
#ifdef ENABLE_WAKEUP
  if(wakeup_create(multi->wakeup_pair) < 0) {
    multi->wakeup_pair[0] = CURL_SOCKET_BAD;
    multi->wakeup_pair[1] = CURL_SOCKET_BAD;
  }
  else if(curlx_nonblock(multi->wakeup_pair[0], TRUE) < 0 ||
          curlx_nonblock(multi->wakeup_pair[1], TRUE) < 0) {
    wakeup_close(multi->wakeup_pair[0]);
    wakeup_close(multi->wakeup_pair[1]);
    multi->wakeup_pair[0] = CURL_SOCKET_BAD;
    multi->wakeup_pair[1] = CURL_SOCKET_BAD;
  }
#endif
#endif

  return multi;

  error:

  sockhash_destroy(&multi->sockhash);
  Curl_hash_destroy(&multi->hostcache);
  Curl_conncache_destroy(&multi->conn_cache);
  Curl_llist_destroy(&multi->msglist, NULL);
  Curl_llist_destroy(&multi->pending, NULL);

  free(multi);
  return NULL;
}